

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c74_min_attribute_impl.h
# Opt level: O2

void __thiscall
c74::min::
attribute<double,(c74::min::threadsafe)1,c74::min::limit::clamp,(c74::min::allow_repetitions)1>::
attribute<std::vector<c74::min::atom,std::allocator<c74::min::atom>>>
          (attribute<double,(c74::min::threadsafe)1,c74::min::limit::clamp,(c74::min::allow_repetitions)1>
           *this,object_base *an_owner,string *a_name,double a_default_value,
          vector<c74::min::atom,_std::allocator<c74::min::atom>_> *args)

{
  bool bVar1;
  undefined4 uVar2;
  mapped_type *ppaVar3;
  double a_default_value_local;
  atoms as;
  
  a_default_value_local = a_default_value;
  attribute_base::attribute_base((attribute_base *)this,an_owner,a_name);
  *(undefined ***)this = &PTR_operator__00199fb8;
  *(undefined8 *)(this + 200) = 0;
  *(undefined8 *)(this + 0xd0) = 0;
  *(undefined8 *)(this + 0xd8) = 0;
  *(undefined8 *)(this + 0xe0) = 0;
  *(undefined8 *)(this + 0xe8) = 0;
  *(undefined8 *)(this + 0xf0) = 0;
  *(undefined8 *)(this + 0xf8) = 0;
  *(undefined8 *)(this + 0x100) = 0;
  *(undefined8 *)(this + 0x108) = 0;
  attribute_threadsafe_helper<double,_(c74::min::threadsafe)1,_c74::min::limit::clamp,_(c74::min::allow_repetitions)1>
  ::attribute_threadsafe_helper
            ((attribute_threadsafe_helper<double,_(c74::min::threadsafe)1,_c74::min::limit::clamp,_(c74::min::allow_repetitions)1>
              *)(this + 0x110),
             (attribute<double,_(c74::min::threadsafe)1,_c74::min::limit::clamp,_(c74::min::allow_repetitions)1>
              *)this);
  ppaVar3 = Catch::clara::std::__detail::
            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_c74::min::attribute_base_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_c74::min::attribute_base_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_c74::min::attribute_base_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_c74::min::attribute_base_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          *)(*(long *)(this + 8) + 0xa0),a_name);
  *ppaVar3 = (mapped_type)this;
  *(undefined8 *)(this + 0x20) = k_sym_float64;
  bVar1 = std::operator==(a_name,"fontname");
  uVar2 = 6;
  if (!bVar1) {
    uVar2 = 0;
  }
  *(undefined4 *)(this + 0x98) = uVar2;
  assign_from_argument<std::vector<c74::min::atom,std::allocator<c74::min::atom>>>(this,args);
  range_copy_helper<double,_(c74::min::threadsafe)1,_c74::min::limit::clamp,_(c74::min::allow_repetitions)1,_0>
            ((attribute<double,_(c74::min::threadsafe)1,_c74::min::limit::clamp,_(c74::min::allow_repetitions)1>
              *)this);
  *(double *)(this + 0xc0) = a_default_value;
  to_atoms<double,_0>(&as,&a_default_value_local);
  (**(code **)(*(long *)this + 8))(this,&as,0,1);
  std::_Vector_base<c74::min::atom,_std::allocator<c74::min::atom>_>::~_Vector_base
            (&as.super__Vector_base<c74::min::atom,_std::allocator<c74::min::atom>_>);
  return;
}

Assistant:

attribute<T, threadsafety, limit_type, repetitions>::attribute(object_base* an_owner, const std::string a_name, const T a_default_value, ARGS... args)
    : attribute_base{ *an_owner, a_name }
{
    m_owner.attributes()[a_name] = this;

    if (is_same<T, bool>::value) {
        m_datatype = k_sym_long;
    }
    else if (is_same<T, int>::value) {
        m_datatype = k_sym_long;
    }
    else if (is_enum<T>::value) {
        m_datatype = k_sym_long;
    }
    else if (is_same<T, symbol>::value) {
        m_datatype = k_sym_symbol;
    }
    else if (is_same<T, float>::value) {
        m_datatype = k_sym_float32;
    }
    else {
        m_datatype = k_sym_float64;
    }

    if (is_same<T, bool>::value) {
        m_style = style::onoff;
    }
    else if (is_enum<T>::value) {
        m_style = style::enum_index;
    }
    else if (is_same<T, ui::color>::value) {
        m_style = style::color;
    }
    else if (a_name == "fontname") {
        m_style = style::font;
    }
    else {
        m_style = style::none;
    }

    handle_arguments(args...);
    copy_range();

    m_default = a_default_value;

    if (is_same<T, ui::color>::value && an_owner->is_ui_class()) {
        auto ui_op = dynamic_cast<ui_operator_base*>(an_owner);
        ui_op->add_color_attribute({ a_name, this });
    }

    auto as = to_atoms(a_default_value);
    set(as, false, true);
}